

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O1

void plutovg_font_face_get_glyph_metrics
               (plutovg_font_face_t *face,float size,plutovg_codepoint_t codepoint,
               float *advance_width,float *left_side_bearing,plutovg_rect_t *extents)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  glyph_t *pgVar4;
  float fVar5;
  
  uVar1 = *(ushort *)((face->info).data + (long)(face->info).head + 0x12);
  fVar5 = size / (float)(ushort)(uVar1 << 8 | uVar1 >> 8);
  pgVar4 = plutovg_font_face_get_glyph(face,codepoint);
  if (advance_width != (float *)0x0) {
    *advance_width = (float)pgVar4->advance_width * fVar5;
  }
  if (left_side_bearing != (float *)0x0) {
    *left_side_bearing = (float)pgVar4->left_side_bearing * fVar5;
  }
  if (extents != (plutovg_rect_t *)0x0) {
    iVar2 = pgVar4->x1;
    extents->x = (float)iVar2 * fVar5;
    iVar3 = pgVar4->y2;
    extents->y = (float)iVar3 * -fVar5;
    extents->w = (float)(pgVar4->x2 - iVar2) * fVar5;
    extents->h = (float)(pgVar4->y1 - iVar3) * -fVar5;
  }
  return;
}

Assistant:

void plutovg_font_face_get_glyph_metrics(plutovg_font_face_t* face, float size, plutovg_codepoint_t codepoint, float* advance_width, float* left_side_bearing, plutovg_rect_t* extents)
{
    float scale = plutovg_font_face_get_scale(face, size);
    glyph_t* glyph = plutovg_font_face_get_glyph(face, codepoint);
    if(advance_width) *advance_width = glyph->advance_width * scale;
    if(left_side_bearing) *left_side_bearing = glyph->left_side_bearing * scale;
    if(extents) {
        extents->x = glyph->x1 * scale;
        extents->y = glyph->y2 * -scale;
        extents->w = (glyph->x2 - glyph->x1) * scale;
        extents->h = (glyph->y1 - glyph->y2) * -scale;
    }
}